

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O3

ostream * __thiscall
wasm::ValidationInfo::fail<wasm::TupleMake*,std::__cxx11::string>
          (ValidationInfo *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *text,TupleMake *curr,
          Function *func)

{
  undefined8 in_RAX;
  ostream *o;
  ostream *poVar1;
  ModuleExpression pair;
  undefined8 uStack_38;
  
  LOCK();
  (this->valid)._M_base._M_i = false;
  UNLOCK();
  uStack_38 = in_RAX;
  o = (ostream *)getStream_abi_cxx11_(this,func);
  if (this->quiet == false) {
    o = printFailureHeader(this,func);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (o,(text->_M_dataplus)._M_p,text->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", on \n",6);
    if (curr != (TupleMake *)0x0) {
      pair.second = (Expression *)curr;
      pair.first = this->wasm;
      poVar1 = std::operator<<(o,pair);
      uStack_38 = CONCAT17(10,(undefined7)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_38 + 7),1);
    }
  }
  return o;
}

Assistant:

std::ostream& fail(S text, T curr, Function* func) {
    valid.store(false);
    auto& stream = getStream(func);
    if (quiet) {
      return stream;
    }
    auto& ret = printFailureHeader(func);
    ret << text << ", on \n";
    return printModuleComponent(curr, ret, wasm);
  }